

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# klvwalk.cpp
# Opt level: O0

void usage(FILE *stream)

{
  FILE *stream_local;
  
  fprintf((FILE *)stream,
          "USAGE: %s [-r|-p] [-v] <input-file> [<input-file2> ...]\n\n       %s [-h|-help] [-V]\n\n  -h | -help   - Show help\n  -r           - When KLV data is an MXF OPAtom or OP 1a file, display headers\n  -p           - Display partition headers by walking the RIP\n  -s           - Allow skipping huge packets when scanning\n  -v           - Verbose. Prints informative messages to stderr\n  -V           - Show version information\n\n  NOTES: o There is no option grouping, all options must be distinct arguments.\n         o All option arguments must be separated from the option by whitespace.\n\n"
          ,PROGRAM_NAME,PROGRAM_NAME);
  return;
}

Assistant:

void
usage(FILE* stream = stdout)
{
  fprintf(stream, "\
USAGE: %s [-r|-p] [-v] <input-file> [<input-file2> ...]\n\
\n\
       %s [-h|-help] [-V]\n\
\n\
  -h | -help   - Show help\n\
  -r           - When KLV data is an MXF OPAtom or OP 1a file, display headers\n\
  -p           - Display partition headers by walking the RIP\n\
  -s           - Allow skipping huge packets when scanning\n\
  -v           - Verbose. Prints informative messages to stderr\n\
  -V           - Show version information\n\
\n\
  NOTES: o There is no option grouping, all options must be distinct arguments.\n\
         o All option arguments must be separated from the option by whitespace.\n\
\n", PROGRAM_NAME, PROGRAM_NAME);
}